

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

void __thiscall jwt::decoded_jwt::decoded_jwt(decoded_jwt *this,string *token)

{
  string *base;
  string *base_00;
  string *base_01;
  long lVar1;
  invalid_argument *piVar2;
  anon_class_1_0_00000001 parse_claims;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_header).header_claims._M_h._M_buckets =
       &(this->super_header).header_claims._M_h._M_single_bucket;
  (this->super_header).header_claims._M_h._M_bucket_count = 1;
  (this->super_header).header_claims._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_header).header_claims._M_h._M_element_count = 0;
  (this->super_header).header_claims._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_header).header_claims._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_header).header_claims._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&this->super_payload;
  (this->super_payload).payload_claims._M_h._M_buckets =
       &(this->super_payload).payload_claims._M_h._M_single_bucket;
  (this->super_payload).payload_claims._M_h._M_bucket_count = 1;
  (this->super_payload).payload_claims._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_payload).payload_claims._M_h._M_element_count = 0;
  (this->super_payload).payload_claims._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_payload).payload_claims._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_payload).payload_claims._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&this->token,(string *)token);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  (this->header)._M_string_length = 0;
  (this->header).field_2._M_local_buf[0] = '\0';
  (this->header_base64)._M_dataplus._M_p = (pointer)&(this->header_base64).field_2;
  (this->header_base64)._M_string_length = 0;
  base = &this->header;
  (this->header_base64).field_2._M_local_buf[0] = '\0';
  (this->payload)._M_dataplus._M_p = (pointer)&(this->payload).field_2;
  (this->payload)._M_string_length = 0;
  local_40 = (string *)&this->header_base64;
  base_00 = &this->payload;
  (this->payload).field_2._M_local_buf[0] = '\0';
  (this->payload_base64)._M_dataplus._M_p = (pointer)&(this->payload_base64).field_2;
  (this->payload_base64)._M_string_length = 0;
  local_48 = (string *)&this->payload_base64;
  (this->payload_base64).field_2._M_local_buf[0] = '\0';
  local_50 = &this->signature;
  (this->signature)._M_dataplus._M_p = (pointer)&(this->signature).field_2;
  (this->signature)._M_string_length = 0;
  (this->signature).field_2._M_local_buf[0] = '\0';
  local_58 = (string *)&this->signature_base64;
  (this->signature_base64)._M_dataplus._M_p = (pointer)&(this->signature_base64).field_2;
  (this->signature_base64)._M_string_length = 0;
  (this->signature_base64).field_2._M_local_buf[0] = '\0';
  local_38 = &this->token;
  lVar1 = std::__cxx11::string::find((char)token,0x2e);
  if (lVar1 == -1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"invalid token supplied");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar1 = std::__cxx11::string::find((char)token,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)token);
    std::__cxx11::string::operator=(local_40,(string *)&local_98);
    std::__cxx11::string::_M_assign((string *)base);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::substr((ulong)&local_98,(ulong)token);
    std::__cxx11::string::operator=(local_48,(string *)&local_98);
    std::__cxx11::string::_M_assign((string *)base_00);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::substr((ulong)&local_98,(ulong)token);
    std::__cxx11::string::operator=(local_58,(string *)&local_98);
    base_01 = local_50;
    std::__cxx11::string::_M_assign((string *)local_50);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::pad<jwt::alphabet::base64url>((string *)&local_98,base);
    std::__cxx11::string::operator=((string *)base,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::pad<jwt::alphabet::base64url>((string *)&local_98,base_00);
    std::__cxx11::string::operator=((string *)base_00,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::pad<jwt::alphabet::base64url>((string *)&local_98,base_01);
    std::__cxx11::string::operator=((string *)base_01,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::decode<jwt::alphabet::base64url>((string *)&local_98,base);
    std::__cxx11::string::operator=((string *)base,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::decode<jwt::alphabet::base64url>((string *)&local_98,base_00);
    std::__cxx11::string::operator=((string *)base_00,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    jwt::base::decode<jwt::alphabet::base64url>((string *)&local_98,base_01);
    std::__cxx11::string::operator=((string *)base_01,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
    string_const___const
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
                *)&local_98,&parse_claims,base);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this,&local_98);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_98);
    decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
    string_const___const
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
                *)&local_98,&parse_claims,base_00);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(local_60,&local_98);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_98);
    return;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"invalid token supplied");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit decoded_jwt(const std::string& token)
			: token(token)
		{
			auto hdr_end = token.find('.');
			if (hdr_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			auto payload_end = token.find('.', hdr_end + 1);
			if (payload_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			header = header_base64 = token.substr(0, hdr_end);
			payload = payload_base64 = token.substr(hdr_end + 1, payload_end - hdr_end - 1);
			signature = signature_base64 = token.substr(payload_end + 1);

			// Fix padding: JWT requires padding to get removed
			header = base::pad<alphabet::base64url>(header);
			payload = base::pad<alphabet::base64url>(payload);
			signature = base::pad<alphabet::base64url>(signature);

			header = base::decode<alphabet::base64url>(header);
			payload = base::decode<alphabet::base64url>(payload);
			signature = base::decode<alphabet::base64url>(signature);

			auto parse_claims = [](const std::string& str) {
				std::unordered_map<std::string, claim> res;
				picojson::value val;
				if (!picojson::parse(val, str).empty())
					throw std::runtime_error("Invalid json");

				for (auto& e : val.get<picojson::object>()) { res.insert({ e.first, claim(e.second) }); }

				return res;
			};

			header_claims = parse_claims(header);
			payload_claims = parse_claims(payload);
		}